

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::ClassType::handleExtends
          (ClassType *this,ExtendsClauseSyntax *extendsClause,ASTContext *context,
          function_ref<void_(const_slang::ast::Symbol_&)> insertCB)

{
  char *pcVar1;
  undefined1 uVar2;
  byte bVar3;
  bitmask<slang::ast::MethodFlags> bVar4;
  undefined2 uVar5;
  ushort uVar6;
  ushort uVar7;
  SymbolKind SVar8;
  Compilation *this_00;
  Type *pTVar9;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_01;
  long lVar10;
  size_t __n;
  uint uVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  int iVar15;
  ClassType *pCVar16;
  Diagnostic *pDVar17;
  SubroutineSymbol *pSVar18;
  uint64_t uVar19;
  TransparentMemberSymbol *pTVar20;
  Symbol *pSVar21;
  SubroutineSymbol *derivedMethod;
  SubroutineSymbol *pSVar22;
  uint uVar23;
  SourceLocation SVar24;
  bool bVar25;
  MethodPrototypeSymbol *this_02;
  DiagCode code;
  DiagCode code_00;
  DiagCode code_01;
  ulong uVar26;
  long lVar27;
  MethodPrototypeSymbol *args;
  ClassType *pCVar28;
  Symbol *member;
  bool bVar29;
  char cVar30;
  undefined1 auVar31 [16];
  SourceRange SVar32;
  size_t *local_88;
  ulong local_80;
  
  this_00 = ((context->scope).ptr)->compilation;
  pCVar16 = Lookup::findClass((extendsClause->baseName).ptr,context,(optional<slang::DiagCode>)0x0);
  if (pCVar16 == (ClassType *)0x0) {
LAB_001e4042:
    this->baseClass = this_00->errorType;
    return;
  }
  if (pCVar16->isInterface == true) {
    this->baseClass = this_00->errorType;
    SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
    code.subsystem = Declarations;
    code.code = 0x39;
  }
  else {
    pCVar28 = pCVar16;
    if (pCVar16->isFinal == false) {
      do {
        if (pCVar28 == this) {
          SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
          pDVar17 = ASTContext::addDiag(context,(DiagCode)0x20009,SVar32);
          Diagnostic::operator<<(pDVar17,(this->super_Type).super_Symbol.name);
          goto LAB_001e4042;
        }
        if ((pCVar28->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(&pCVar28->super_Scope);
        }
        pTVar9 = pCVar28->baseClass;
        if (pTVar9 == (Type *)0x0) {
LAB_001e3c12:
          bVar25 = false;
        }
        else {
          if (pTVar9->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar9);
          }
          if ((pTVar9->canonical->super_Symbol).kind == ErrorType) goto LAB_001e3c12;
          pCVar28 = (ClassType *)pTVar9->canonical;
          bVar25 = true;
        }
      } while (bVar25);
      this->baseClass = &pCVar16->super_Type;
      if ((this->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&this->super_Scope);
      }
      this_01 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                (this->super_Scope).nameMap;
      if ((pCVar16->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pCVar16->super_Scope);
      }
      this_02 = (MethodPrototypeSymbol *)(pCVar16->super_Scope).firstMember;
      if (this_02 != (MethodPrototypeSymbol *)0x0) {
        bVar25 = false;
        do {
          if ((this_02->super_Symbol).name._M_len != 0) {
            SVar8 = (this_02->super_Symbol).kind;
            if (SVar8 == MethodPrototype) {
              if ((*(byte *)&(this_02->flags).m_bits & 8) == 0) goto LAB_001e3cde;
              pSVar18 = MethodPrototypeSymbol::getSubroutine(this_02);
              this->baseConstructor = &pSVar18->super_Symbol;
            }
            else if ((SVar8 == Subroutine) && ((this_02->field_0xc4 & 8) != 0)) {
              this->baseConstructor = &this_02->super_Symbol;
            }
            else {
LAB_001e3cde:
              uVar19 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 (this_01,&(this_02->super_Symbol).name);
              uVar26 = uVar19 >> ((byte)*this_01 & 0x3f);
              lVar10 = *(long *)(this_01 + 0x10);
              lVar27 = (uVar19 & 0xff) * 4;
              cVar30 = (&UNK_0047fb5c)[lVar27];
              cVar12 = (&UNK_0047fb5d)[lVar27];
              cVar13 = (&UNK_0047fb5e)[lVar27];
              cVar14 = (&UNK_0047fb5f)[lVar27];
              local_80 = 0;
              do {
                pcVar1 = (char *)(lVar10 + uVar26 * 0x10);
                auVar31[0] = -(*pcVar1 == cVar30);
                auVar31[1] = -(pcVar1[1] == cVar12);
                auVar31[2] = -(pcVar1[2] == cVar13);
                auVar31[3] = -(pcVar1[3] == cVar14);
                auVar31[4] = -(pcVar1[4] == cVar30);
                auVar31[5] = -(pcVar1[5] == cVar12);
                auVar31[6] = -(pcVar1[6] == cVar13);
                auVar31[7] = -(pcVar1[7] == cVar14);
                auVar31[8] = -(pcVar1[8] == cVar30);
                auVar31[9] = -(pcVar1[9] == cVar12);
                auVar31[10] = -(pcVar1[10] == cVar13);
                auVar31[0xb] = -(pcVar1[0xb] == cVar14);
                auVar31[0xc] = -(pcVar1[0xc] == cVar30);
                auVar31[0xd] = -(pcVar1[0xd] == cVar12);
                auVar31[0xe] = -(pcVar1[0xe] == cVar13);
                auVar31[0xf] = -(pcVar1[0xf] == cVar14);
                uVar23 = (uint)(ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe);
                if (uVar23 != 0) {
                  lVar27 = *(long *)(this_01 + 0x18);
                  __n = (this_02->super_Symbol).name._M_len;
                  pcVar1 = *(char **)((long)&(this_02->super_Symbol).name + 8);
                  do {
                    uVar11 = 0;
                    if (uVar23 != 0) {
                      for (; (uVar23 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                      }
                    }
                    local_88 = (size_t *)(lVar27 + uVar26 * 0x168 + (ulong)uVar11 * 0x18);
                    bVar29 = __n == *local_88;
                    if (bVar29 && __n != 0) {
                      iVar15 = bcmp(pcVar1,(void *)local_88[1],__n);
                      bVar29 = iVar15 == 0;
                    }
                    if (bVar29) goto LAB_001e3e61;
                    uVar23 = uVar23 - 1 & uVar23;
                  } while (uVar23 != 0);
                }
                if ((*(byte *)(uVar26 * 0x10 + lVar10 + 0xf) &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7]) == 0) break;
                lVar27 = uVar26 + local_80;
                local_80 = local_80 + 1;
                uVar26 = lVar27 + 1U & *(ulong *)(this_01 + 8);
              } while (local_80 <= *(ulong *)(this_01 + 8));
              local_88 = (size_t *)0x0;
LAB_001e3e61:
              if (local_88 == (size_t *)0x0) {
                args = this_02;
                if ((this_02->super_Symbol).kind == TransparentMember) {
                  args = (MethodPrototypeSymbol *)(this_02->super_Scope).compilation;
                }
                if ((this->isAbstract == false) && ((args->super_Symbol).kind == MethodPrototype)) {
                  bVar4.m_bits = (args->flags).m_bits;
                  if (((bVar4.m_bits & 2) != 0) && (!bVar25)) {
                    SVar32 = slang::syntax::SyntaxNode::sourceRange
                                       (&extendsClause->super_SyntaxNode);
                    pDVar17 = ASTContext::addDiag(context,(DiagCode)0x4b0006,SVar32);
                    Diagnostic::operator<<(pDVar17,(this->super_Type).super_Symbol.name);
                    Diagnostic::operator<<(pDVar17,(pCVar16->super_Type).super_Symbol.name);
                    Diagnostic::operator<<(pDVar17,(args->super_Symbol).name);
                    Diagnostic::addNote(pDVar17,(DiagCode)0x50001,(args->super_Symbol).location);
                    bVar25 = true;
                  }
                  if ((bVar4.m_bits & 2) != 0) goto LAB_001e3cd0;
                }
                if ((this->isAbstract == false) && ((args->super_Symbol).kind == ConstraintBlock)) {
                  pTVar9 = (args->declaredReturnType).type;
                  if ((((ulong)pTVar9 & 2) != 0) && (!bVar25)) {
                    SVar32 = slang::syntax::SyntaxNode::sourceRange
                                       (&extendsClause->super_SyntaxNode);
                    pDVar17 = ASTContext::addDiag(context,(DiagCode)0x4c0006,SVar32);
                    Diagnostic::operator<<(pDVar17,(this->super_Type).super_Symbol.name);
                    Diagnostic::operator<<(pDVar17,(pCVar16->super_Type).super_Symbol.name);
                    Diagnostic::operator<<(pDVar17,(args->super_Symbol).name);
                    Diagnostic::addNote(pDVar17,(DiagCode)0x50001,(args->super_Symbol).location);
                    bVar25 = true;
                  }
                  if (((ulong)pTVar9 & 2) != 0) goto LAB_001e3cd0;
                }
                pTVar20 = BumpAllocator::
                          emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                                    (&this_00->super_BumpAllocator,&args->super_Symbol);
                (*insertCB.callback)(insertCB.callable,&pTVar20->super_Symbol);
              }
            }
          }
LAB_001e3cd0:
          this_02 = (MethodPrototypeSymbol *)(this_02->super_Symbol).nextInScope;
        } while (this_02 != (MethodPrototypeSymbol *)0x0);
      }
      if ((this->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&this->super_Scope);
      }
      pSVar18 = (SubroutineSymbol *)(this->super_Scope).firstMember;
      do {
        if (pSVar18 == (SubroutineSymbol *)0x0) {
          return;
        }
        SVar8 = (pSVar18->super_Symbol).kind;
        if (SVar8 == Subroutine) {
          pCVar28 = pCVar16;
          if (((pSVar18->flags).m_bits & 0xc) == 0) {
            do {
              pSVar22 = (SubroutineSymbol *)
                        Scope::find(&pCVar28->super_Scope,(pSVar18->super_Symbol).name);
              if (pSVar22 == (SubroutineSymbol *)0x0) {
                if ((pCVar28->super_Scope).deferredMemberIndex != Invalid) {
                  Scope::elaborate(&pCVar28->super_Scope);
                }
                pTVar9 = pCVar28->baseClass;
                if (pTVar9 == (Type *)0x0) {
                  cVar30 = '\x03';
                }
                else {
                  if (pTVar9->canonical == (Type *)0x0) {
                    Type::resolveCanonical(pTVar9);
                  }
                  cVar30 = (((ClassType *)pTVar9->canonical)->super_Type).super_Symbol.kind ==
                           ErrorType;
                  if (!(bool)cVar30) {
                    pCVar28 = (ClassType *)pTVar9->canonical;
                  }
                }
              }
              else {
                cVar30 = '\x03';
                if ((pSVar22->super_Symbol).kind == Subroutine) {
                  uVar6 = (pSVar18->flags).m_bits;
                  if (((uVar6 >> 0xd & 1) == 0) ||
                     ((((pSVar22->flags).m_bits & 0x4001) == 0 &&
                      (pSVar22->overrides == (SubroutineSymbol *)0x0)))) {
                    uVar7 = (pSVar22->flags).m_bits;
                    if ((short)uVar7 < 0) {
                      SVar24 = (pSVar18->super_Symbol).location;
                      code_01.subsystem = Declarations;
                      code_01.code = 0x91;
                      goto LAB_001e4523;
                    }
                    if ((((uVar6 >> 0xe & 1) != 0) && ((uVar7 & 0x4001) == 0)) &&
                       (pSVar22->overrides == (SubroutineSymbol *)0x0)) {
                      pDVar17 = ASTContext::addDiag(context,(DiagCode)0x920005,
                                                    (pSVar18->super_Symbol).location);
                      Diagnostic::operator<<(pDVar17,(pSVar18->super_Symbol).name);
                    }
                  }
                  else {
                    SVar24 = (pSVar18->super_Symbol).location;
                    code_01.subsystem = Declarations;
                    code_01.code = 0x92;
LAB_001e4523:
                    pDVar17 = ASTContext::addDiag(context,code_01,SVar24);
                    Diagnostic::operator<<(pDVar17,(pSVar18->super_Symbol).name);
                    Diagnostic::addNote(pDVar17,(DiagCode)0x50001,(pSVar22->super_Symbol).location);
                  }
                  cVar30 = '\x01';
                  if ((((pSVar22->flags).m_bits & 0x4001) != 0) ||
                     (pSVar22->overrides != (SubroutineSymbol *)0x0)) {
                    SubroutineSymbol::setOverride(pSVar18,pSVar22);
                  }
                }
              }
            } while (cVar30 == '\0');
            if (cVar30 == '\x03') {
              bVar3 = *(byte *)((long)&(pSVar18->flags).m_bits + 1);
joined_r0x001e4592:
              if ((bVar3 & 0x40) != 0) {
                pDVar17 = ASTContext::addDiag(context,(DiagCode)0x920005,
                                              (pSVar18->super_Symbol).location);
                Diagnostic::operator<<(pDVar17,(pSVar18->super_Symbol).name);
              }
            }
          }
        }
        else if (SVar8 == MethodPrototype) {
          pCVar28 = pCVar16;
          if ((pSVar18->visibility & 0xc) == Public) {
            do {
              pSVar21 = Scope::find(&pCVar28->super_Scope,(pSVar18->super_Symbol).name);
              if (pSVar21 == (Symbol *)0x0) {
                if ((pCVar28->super_Scope).deferredMemberIndex != Invalid) {
                  Scope::elaborate(&pCVar28->super_Scope);
                }
                pTVar9 = pCVar28->baseClass;
                if (pTVar9 == (Type *)0x0) {
                  cVar30 = '\x03';
                }
                else {
                  if (pTVar9->canonical == (Type *)0x0) {
                    Type::resolveCanonical(pTVar9);
                  }
                  cVar30 = (((ClassType *)pTVar9->canonical)->super_Type).super_Symbol.kind ==
                           ErrorType;
                  if (!(bool)cVar30) {
                    pCVar28 = (ClassType *)pTVar9->canonical;
                  }
                }
              }
              else {
                cVar30 = '\x03';
                if (pSVar21->kind == Subroutine) {
                  uVar5 = (undefined2)pSVar18->visibility;
                  if ((((ushort)uVar5 >> 0xd & 1) == 0) ||
                     (((*(ushort *)&pSVar21[3].field_0x4 & 0x4001) == 0 &&
                      (pSVar21[4].name._M_len == 0)))) {
                    if ((short)*(ushort *)&pSVar21[3].field_0x4 < 0) {
                      SVar24 = (pSVar18->super_Symbol).location;
                      code_00.subsystem = Declarations;
                      code_00.code = 0x91;
                      goto LAB_001e432f;
                    }
                    if (((((ushort)uVar5 >> 0xe & 1) != 0) &&
                        ((*(ushort *)&pSVar21[3].field_0x4 & 0x4001) == 0)) &&
                       (pSVar21[4].name._M_len == 0)) {
                      pDVar17 = ASTContext::addDiag(context,(DiagCode)0x920005,
                                                    (pSVar18->super_Symbol).location);
                      Diagnostic::operator<<(pDVar17,(pSVar18->super_Symbol).name);
                    }
                  }
                  else {
                    SVar24 = (pSVar18->super_Symbol).location;
                    code_00.subsystem = Declarations;
                    code_00.code = 0x92;
LAB_001e432f:
                    pDVar17 = ASTContext::addDiag(context,code_00,SVar24);
                    Diagnostic::operator<<(pDVar17,(pSVar18->super_Symbol).name);
                    Diagnostic::addNote(pDVar17,(DiagCode)0x50001,pSVar21->location);
                  }
                  cVar30 = '\x01';
                  if (((*(ushort *)&pSVar21[3].field_0x4 & 0x4001) != 0) ||
                     (pSVar21[4].name._M_len != 0)) {
                    (pSVar18->blocks)._M_extent._M_extent_value = (size_t)pSVar21;
                  }
                }
              }
            } while (cVar30 == '\0');
            if ((cVar30 == '\x03') && ((pSVar18->visibility & 0x4000) != Public)) {
              pDVar17 = ASTContext::addDiag(context,(DiagCode)0x920005,
                                            (pSVar18->super_Symbol).location);
              Diagnostic::operator<<(pDVar17,(pSVar18->super_Symbol).name);
            }
          }
          pSVar22 = (SubroutineSymbol *)(pSVar18->blocks)._M_extent._M_extent_value;
          if ((pSVar22 != (SubroutineSymbol *)0x0) &&
             (derivedMethod = MethodPrototypeSymbol::getSubroutine((MethodPrototypeSymbol *)pSVar18)
             , derivedMethod != (SubroutineSymbol *)0x0)) {
            SubroutineSymbol::checkVirtualMethodMatch
                      ((context->scope).ptr,pSVar22,derivedMethod,true);
          }
        }
        else if (SVar8 == ConstraintBlock) {
          bVar25 = false;
          pCVar28 = pCVar16;
          do {
            pSVar21 = Scope::find(&pCVar28->super_Scope,(pSVar18->super_Symbol).name);
            if (pSVar21 == (Symbol *)0x0) {
              if ((pCVar28->super_Scope).deferredMemberIndex != Invalid) {
                Scope::elaborate(&pCVar28->super_Scope);
              }
              pTVar9 = pCVar28->baseClass;
              if (pTVar9 == (Type *)0x0) goto LAB_001e41d6;
              if (pTVar9->canonical == (Type *)0x0) {
                Type::resolveCanonical(pTVar9);
              }
              if ((pTVar9->canonical->super_Symbol).kind == ErrorType) goto LAB_001e41d6;
              pCVar28 = (ClassType *)pTVar9->canonical;
              bVar29 = true;
            }
            else {
              if (pSVar21->kind == ConstraintBlock) {
                uVar2 = (undefined1)pSVar21[2].kind;
                if (((uVar2 & Definition) != Unknown) &&
                   ((byte)(uVar2 & DeferredMember) >> 2 !=
                    (*(byte *)&(pSVar18->declaredReturnType).type & 4) >> 2)) {
                  pDVar17 = ASTContext::addDiag(context,(DiagCode)0x790006,
                                                (pSVar18->super_Symbol).location);
                  Diagnostic::addNote(pDVar17,(DiagCode)0x50001,pSVar21->location);
                }
                if (((ulong)(pSVar18->declaredReturnType).type & 0x20) == 0) {
                  bVar25 = true;
                  if ((char)pSVar21[2].kind < '\0') {
                    pDVar17 = ASTContext::addDiag(context,(DiagCode)0x910006,
                                                  (pSVar18->super_Symbol).location);
                    Diagnostic::operator<<(pDVar17,(pSVar18->super_Symbol).name);
                    Diagnostic::addNote(pDVar17,(DiagCode)0x50001,pSVar21->location);
                  }
                }
                else {
                  pDVar17 = ASTContext::addDiag(context,(DiagCode)0x920006,
                                                (pSVar18->super_Symbol).location);
                  Diagnostic::operator<<(pDVar17,(pSVar18->super_Symbol).name);
                  Diagnostic::addNote(pDVar17,(DiagCode)0x50001,pSVar21->location);
                  bVar25 = true;
                }
              }
LAB_001e41d6:
              bVar29 = false;
            }
          } while (bVar29);
          if (!bVar25) {
            bVar3 = *(byte *)&(pSVar18->declaredReturnType).type;
            goto joined_r0x001e4592;
          }
        }
        pSVar18 = (SubroutineSymbol *)(pSVar18->super_Symbol).nextInScope;
      } while( true );
    }
    this->baseClass = this_00->errorType;
    SVar32 = slang::syntax::SyntaxNode::sourceRange(&extendsClause->super_SyntaxNode);
    code.subsystem = Declarations;
    code.code = 0x38;
  }
  pDVar17 = ASTContext::addDiag(context,code,SVar32);
  Diagnostic::operator<<(pDVar17,(pCVar16->super_Type).super_Symbol.name);
  return;
}

Assistant:

void ClassType::handleExtends(const ExtendsClauseSyntax& extendsClause, const ASTContext& context,
                              function_ref<void(const Symbol&)> insertCB) const {
    auto& comp = context.getCompilation();
    auto baseType = Lookup::findClass(*extendsClause.baseName, context);
    if (!baseType) {
        baseClass = &comp.getErrorType();
        return;
    }

    // A normal class can't extend an interface class. This method won't be called
    // for an interface class, so we don't need to check that again here.
    if (baseType->isInterface) {
        baseClass = &comp.getErrorType();
        context.addDiag(diag::ExtendIfaceFromClass, extendsClause.sourceRange()) << baseType->name;
        return;
    }

    if (baseType->isFinal) {
        baseClass = &comp.getErrorType();
        context.addDiag(diag::ExtendFromFinal, extendsClause.sourceRange()) << baseType->name;
        return;
    }

    // Make sure there are no cycles in the inheritance chain.
    auto currBase = baseType;
    while (true) {
        if (currBase == this) {
            context.addDiag(diag::ClassInheritanceCycle, extendsClause.sourceRange()) << name;
            baseClass = &comp.getErrorType();
            return;
        }

        auto next = currBase->getBaseClass();
        if (!next || next->isError())
            break;

        currBase = &next->getCanonicalType().as<ClassType>();
    }

    // Assign this member before resolving anything below, because they
    // may try to check the base class of this type.
    baseClass = baseType;

    // Inherit all base class members that don't conflict with our declared symbols.
    auto& scopeNameMap = getNameMap();
    bool pureVirtualError = false;

    for (auto& member : baseType->members()) {
        if (member.name.empty())
            continue;

        // Don't inherit constructors.
        if (member.kind == SymbolKind::Subroutine &&
            member.as<SubroutineSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = &member;
            continue;
        }
        if (member.kind == SymbolKind::MethodPrototype &&
            member.as<MethodPrototypeSymbol>().flags.has(MethodFlags::Constructor)) {
            baseConstructor = member.as<MethodPrototypeSymbol>().getSubroutine();
            continue;
        }

        // Don't inherit if the member is already overridden.
        if (auto it = scopeNameMap.find(member.name); it != scopeNameMap.end())
            continue;

        // If the symbol itself was already inherited, create a new wrapper around
        // it for our own scope.
        const Symbol* toWrap = &member;
        if (member.kind == SymbolKind::TransparentMember)
            toWrap = &member.as<TransparentMemberSymbol>().wrapped;

        // If this is a pure virtual method being inherited and we aren't ourselves
        // an abstract class, issue an error.
        if (!isAbstract && toWrap->kind == SymbolKind::MethodPrototype) {
            auto& sub = toWrap->as<MethodPrototypeSymbol>();
            if (sub.flags.has(MethodFlags::Pure)) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstract,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << sub.name;
                    diag.addNote(diag::NoteDeclarationHere, sub.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        if (!isAbstract && toWrap->kind == SymbolKind::ConstraintBlock) {
            auto& cb = toWrap->as<ConstraintBlockSymbol>();
            if (cb.flags.has(ConstraintBlockFlags::Pure)) {
                if (!pureVirtualError) {
                    auto& diag = context.addDiag(diag::InheritFromAbstractConstraint,
                                                 extendsClause.sourceRange());
                    diag << name;
                    diag << baseType->name;
                    diag << cb.name;
                    diag.addNote(diag::NoteDeclarationHere, cb.location);
                    pureVirtualError = true;
                }
                continue;
            }
        }

        // All symbols get inserted into the beginning of the scope using the
        // provided insertion callback. We insert them as TransparentMemberSymbols
        // so that we can trace a path back to the actual location they are declared.
        auto wrapper = comp.emplace<TransparentMemberSymbol>(*toWrap);
        insertCB(*wrapper);
    }

    auto checkOverrideSpecifiers = [&](auto& base, auto& derived) {
        if (derived.flags.has(MethodFlags::Initial) && base.isVirtual()) {
            auto& diag = context.addDiag(diag::OverridingInitial, derived.location);
            diag << derived.name;
            diag.addNote(diag::NoteDeclarationHere, base.location);
        }
        else if (base.flags.has(MethodFlags::Final)) {
            auto& diag = context.addDiag(diag::OverridingFinal, derived.location);
            diag << derived.name;
            diag.addNote(diag::NoteDeclarationHere, base.location);
        }
        else if (!base.isVirtual() && derived.flags.has(MethodFlags::Extends)) {
            context.addDiag(diag::OverridingExtends, derived.location) << derived.name;
        }
    };

    auto checkForOverride = [&](auto& member) {
        // Constructors and static methods can never be virtual.
        if (member.flags.has(MethodFlags::Constructor | MethodFlags::Static))
            return;

        // Look in the parent class for a method with the same name.
        auto currentBase = baseType;
        while (true) {
            const Symbol* found = currentBase->find(member.name);
            if (found) {
                if (found->kind == SymbolKind::Subroutine) {
                    auto& baseSub = found->as<SubroutineSymbol>();
                    checkOverrideSpecifiers(baseSub, member);
                    if (baseSub.isVirtual())
                        member.setOverride(baseSub);
                    return;
                }
                break;
            }

            // Otherwise it could be inherited from a higher-level base.
            auto possibleBase = currentBase->getBaseClass();
            if (!possibleBase)
                break;

            if (possibleBase->isError())
                return;

            currentBase = &possibleBase->getCanonicalType().as<ClassType>();
        }

        // No base method found; if our member is marked 'extends' it's an error.
        if (member.flags.has(MethodFlags::Extends))
            context.addDiag(diag::OverridingExtends, member.location) << member.name;
    };

    // Check all methods in our class for overriding virtual methods in parent classes.
    for (auto& member : members()) {
        if (member.kind == SymbolKind::Subroutine) {
            checkForOverride(member.as<SubroutineSymbol>());
        }
        else if (member.kind == SymbolKind::MethodPrototype) {
            auto& proto = member.as<MethodPrototypeSymbol>();
            checkForOverride(proto);

            if (auto baseSub = proto.getOverride()) {
                if (auto protoSub = proto.getSubroutine()) {
                    SubroutineSymbol::checkVirtualMethodMatch(*context.scope,
                                                              baseSub->as<SubroutineSymbol>(),
                                                              *protoSub,
                                                              /* allowDerivedReturn */ true);
                }
            }
        }
        else if (member.kind == SymbolKind::ConstraintBlock) {
            // Constraint blocks can also be overridden -- check that 'static'ness
            // matches between base and derived if the base is pure.
            bool isOverridden = false;
            auto currentBase = baseType;
            auto& derived = member.as<ConstraintBlockSymbol>();
            while (true) {
                const Symbol* found = currentBase->find(member.name);
                if (found) {
                    if (found->kind == SymbolKind::ConstraintBlock) {
                        isOverridden = true;
                        auto& baseConstraint = found->as<ConstraintBlockSymbol>();
                        if (baseConstraint.flags.has(ConstraintBlockFlags::Pure) &&
                            baseConstraint.flags.has(ConstraintBlockFlags::Static) !=
                                member.as<ConstraintBlockSymbol>().flags.has(
                                    ConstraintBlockFlags::Static)) {
                            auto& diag = context.addDiag(diag::MismatchStaticConstraint,
                                                         member.location);
                            diag.addNote(diag::NoteDeclarationHere, found->location);
                        }

                        if (derived.flags.has(ConstraintBlockFlags::Initial)) {
                            auto& diag = context.addDiag(diag::OverridingInitial, derived.location);
                            diag << derived.name;
                            diag.addNote(diag::NoteDeclarationHere, baseConstraint.location);
                        }
                        else if (baseConstraint.flags.has(ConstraintBlockFlags::Final)) {
                            auto& diag = context.addDiag(diag::OverridingFinal, derived.location);
                            diag << derived.name;
                            diag.addNote(diag::NoteDeclarationHere, baseConstraint.location);
                        }
                    }
                    break;
                }

                // Otherwise it could be inherited from a higher-level base.
                auto possibleBase = currentBase->getBaseClass();
                if (!possibleBase || possibleBase->isError())
                    break;

                currentBase = &possibleBase->getCanonicalType().as<ClassType>();
            }

            if (!isOverridden && derived.flags.has(ConstraintBlockFlags::Extends))
                context.addDiag(diag::OverridingExtends, member.location) << member.name;
        }
    }
}